

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void VW::finish(vw *all,bool delete_all)

{
  vw_ostream *pvVar1;
  double dVar2;
  options_i *poVar3;
  _func_int *p_Var4;
  parser *this;
  int *piVar5;
  pointer pdVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  vw_ostream *pvVar11;
  vw_exception *this_00;
  bool *pbVar12;
  size_t i_1;
  char *pcVar13;
  shared_data *psVar14;
  size_t i;
  ulong uVar15;
  long lVar16;
  float best_constant_loss;
  undefined4 local_ac;
  vw_exception finalize_regressor_exception;
  string local_70;
  string local_50;
  
  if (all->quiet != false) goto LAB_00125a94;
  poVar3 = all->options;
  std::__cxx11::string::string
            ((string *)&finalize_regressor_exception,"audit_regressor",
             (allocator *)&best_constant_loss);
  iVar9 = (*poVar3->_vptr_options_i[1])(poVar3,&finalize_regressor_exception);
  std::__cxx11::string::~string((string *)&finalize_regressor_exception);
  if ((char)iVar9 != '\0') goto LAB_00125a94;
  pvVar1 = &all->trace_message;
  *(undefined8 *)
   ((all->trace_message).super_ostream._vptr_basic_ostream[-3] + 8 +
   (long)&(all->trace_message).super_ostream._vptr_basic_ostream) = 6;
  p_Var4 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
  *(uint *)(p_Var4 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) =
       *(uint *)(p_Var4 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) &
       0xfffffefb | 4;
  poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
  std::operator<<(poVar10,"finished run");
  uVar15 = all->current_pass;
  poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
  if (uVar15 < 2) {
    poVar10 = std::operator<<(poVar10,"number of examples = ");
  }
  else {
    poVar10 = std::operator<<(poVar10,"number of examples per pass = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    poVar10 = std::operator<<(poVar10,"passes used = ");
  }
  std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
  std::operator<<(poVar10,"weighted example sum = ");
  std::ostream::_M_insert<double>
            (all->sd->weighted_labeled_examples + all->sd->weighted_unlabeled_examples);
  poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
  std::operator<<(poVar10,"weighted label sum = ");
  std::ostream::_M_insert<double>(all->sd->weighted_labels);
  poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
  std::operator<<(poVar10,"average loss = ");
  psVar14 = all->sd;
  pvVar11 = pvVar1;
  if (all->holdout_set_off == true) {
    if (psVar14->weighted_labeled_examples <= 0.0) {
      pcVar13 = "n.a.";
      goto LAB_00125951;
    }
    std::ostream::_M_insert<double>(psVar14->sum_loss / psVar14->weighted_labeled_examples);
  }
  else {
    dVar2 = psVar14->holdout_best_loss;
    if (((dVar2 == 3.4028234663852886e+38) && (!NAN(dVar2))) ||
       ((dVar2 == 1.7014117331926443e+38 && (!NAN(dVar2))))) {
      pcVar13 = "undefined (no holdout)";
    }
    else {
      pvVar11 = (vw_ostream *)std::ostream::_M_insert<double>(dVar2);
      pcVar13 = " h";
    }
LAB_00125951:
    std::operator<<(&pvVar11->super_ostream,pcVar13);
  }
  if (all->sd->report_multiclass_log_loss == true) {
    bVar8 = all->holdout_set_off;
    poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    std::operator<<(poVar10,"average multiclass log loss = ");
    psVar14 = all->sd;
    if (bVar8 == true) {
      std::ostream::_M_insert<double>
                (psVar14->multiclass_log_loss / psVar14->weighted_labeled_examples);
    }
    else {
      poVar10 = std::ostream::_M_insert<double>
                          (psVar14->holdout_multiclass_log_loss / psVar14->weighted_labeled_examples
                          );
      std::operator<<(poVar10," h");
    }
  }
  bVar8 = get_best_constant(all,(float *)&finalize_regressor_exception,&best_constant_loss);
  if (bVar8) {
    poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    poVar10 = std::operator<<(poVar10,"best constant = ");
    std::ostream::operator<<(poVar10,(float)finalize_regressor_exception._0_4_);
    if ((best_constant_loss != 1.1754944e-38) || (NAN(best_constant_loss))) {
      poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
      poVar10 = std::operator<<(poVar10,"best constant\'s loss = ");
      std::ostream::operator<<(poVar10,best_constant_loss);
    }
  }
  poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
  poVar10 = std::operator<<(poVar10,"total feature number = ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  if (all->sd->queries != 0) {
    poVar10 = std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    poVar10 = std::operator<<(poVar10,"total queries = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  }
  std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
LAB_00125a94:
  std::__cxx11::string::string((string *)&local_50,"empty",(allocator *)&best_constant_loss);
  vw_exception::vw_exception
            (&finalize_regressor_exception,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x70b,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,(string *)&all->final_regressor_name);
  finalize_regressor(all,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (all->l != (learner<char,_char> *)0x0) {
    LEARNER::learner<char,_char>::finish(all->l);
    free(all->l);
  }
  if ((all->should_delete_options == true) && (all->options != (options_i *)0x0)) {
    (*all->options->_vptr_options_i[9])();
  }
  free_parser(all);
  finalize_source(all->p);
  v_array<substring>::clear(&all->p->parse_name);
  v_array<substring>::delete_v(&all->p->parse_name);
  this = all->p;
  if (this != (parser *)0x0) {
    parser::~parser(this);
  }
  operator_delete(this);
  pbVar12 = &(all->weights).dense_weights._seeded;
  if ((all->weights).sparse != false) {
    pbVar12 = &(all->weights).sparse_weights._seeded;
  }
  if (*pbVar12 == false) {
    psVar14 = all->sd;
    if (psVar14->ldict != (namedlabels *)0x0) {
      namedlabels::~namedlabels(psVar14->ldict);
      free(all->sd->ldict);
      psVar14 = all->sd;
    }
    free(psVar14);
  }
  for (uVar15 = 0; piVar5 = (all->final_prediction_sink)._begin,
      uVar15 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar5 >> 2);
      uVar15 = uVar15 + 1) {
    iVar9 = piVar5[uVar15];
    if (iVar9 != 1) {
      io_buf::close_file_or_socket(iVar9);
    }
  }
  local_ac = 0;
  v_array<int>::delete_v(&all->final_prediction_sink);
  lVar16 = 0;
  for (uVar15 = 0;
      pdVar6 = (all->loaded_dictionaries).
               super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)(((long)(all->loaded_dictionaries).
                              super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6) / 0x18);
      uVar15 = uVar15 + 1) {
    free(*(void **)((long)&pdVar6->name + lVar16));
    v_hashmap<substring,_features_*>::iter
              (*(v_hashmap<substring,_features_*> **)
                ((long)&((all->loaded_dictionaries).
                         super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>.
                         _M_impl.super__Vector_impl_data._M_start)->dict + lVar16),
               delete_dictionary_entry);
    v_array<v_hashmap<substring,_features_*>::hash_elem>::delete_v
              ((v_array<v_hashmap<substring,_features_*>::hash_elem> *)
               (*(long *)((long)&((all->loaded_dictionaries).
                                  super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->dict + lVar16) + 0x18)
              );
    free(*(void **)((long)&((all->loaded_dictionaries).
                            super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>.
                            _M_impl.super__Vector_impl_data._M_start)->dict + lVar16));
    lVar16 = lVar16 + 0x18;
  }
  if (all->loss != (loss_function *)0x0) {
    (*all->loss->_vptr_loss_function[9])();
  }
  uVar7 = local_ac;
  if (all->all_reduce != (AllReduce *)0x0) {
    (*all->all_reduce->_vptr_AllReduce[1])();
  }
  if (delete_all) {
    vw::~vw(all);
    operator_delete(all);
  }
  if ((char)uVar7 != '\0') {
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    vw_exception::vw_exception(this_00,&finalize_regressor_exception);
    __cxa_throw(this_00,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  vw_exception::~vw_exception(&finalize_regressor_exception);
  return;
}

Assistant:

void finish(vw& all, bool delete_all)
{
  // also update VowpalWabbit::PerformanceStatistics::get() (vowpalwabbit.cpp)
  if (!all.quiet && !all.options->was_supplied("audit_regressor"))
  {
    all.trace_message.precision(6);
    all.trace_message << std::fixed;
    all.trace_message << endl << "finished run";
    if (all.current_pass == 0 || all.current_pass == 1)
      all.trace_message << endl << "number of examples = " << all.sd->example_number;
    else
    {
      all.trace_message << endl << "number of examples per pass = " << all.sd->example_number / all.current_pass;
      all.trace_message << endl << "passes used = " << all.current_pass;
    }
    all.trace_message << endl << "weighted example sum = " << all.sd->weighted_examples();
    all.trace_message << endl << "weighted label sum = " << all.sd->weighted_labels;
    all.trace_message << endl << "average loss = ";
    if (all.holdout_set_off)
      if (all.sd->weighted_labeled_examples > 0)
        all.trace_message << all.sd->sum_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << "n.a.";
    else if ((all.sd->holdout_best_loss == FLT_MAX) || (all.sd->holdout_best_loss == FLT_MAX * 0.5))
      all.trace_message << "undefined (no holdout)";
    else
      all.trace_message << all.sd->holdout_best_loss << " h";
    if (all.sd->report_multiclass_log_loss)
    {
      if (all.holdout_set_off)
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->multiclass_log_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->holdout_multiclass_log_loss / all.sd->weighted_labeled_examples << " h";
    }

    float best_constant;
    float best_constant_loss;
    if (get_best_constant(all, best_constant, best_constant_loss))
    {
      all.trace_message << endl << "best constant = " << best_constant;
      if (best_constant_loss != FLT_MIN)
        all.trace_message << endl << "best constant's loss = " << best_constant_loss;
    }

    all.trace_message << endl << "total feature number = " << all.sd->total_features;
    if (all.sd->queries > 0)
      all.trace_message << endl << "total queries = " << all.sd->queries;
    all.trace_message << endl;
  }

  // implement finally.
  // finalize_regressor can throw if it can't write the file.
  // we still want to free up all the memory.
  vw_exception finalize_regressor_exception(__FILE__, __LINE__, "empty");
  bool finalize_regressor_exception_thrown = false;
  try
  {
    finalize_regressor(all, all.final_regressor_name);
  }
  catch (vw_exception& e)
  {
    finalize_regressor_exception = e;
    finalize_regressor_exception_thrown = true;
  }

  if (all.l != nullptr)
  {
    all.l->finish();
    free_it(all.l);
  }

  // Check if options object lifetime is managed internally.
  if (all.should_delete_options)
    delete all.options;

  // TODO: migrate all finalization into parser destructor
  free_parser(all);
  finalize_source(all.p);
  all.p->parse_name.clear();
  all.p->parse_name.delete_v();
  delete all.p;
  bool seeded;
  if (all.weights.seeded() > 0)
    seeded = true;
  else
    seeded = false;
  if (!seeded)
  {
    if (all.sd->ldict)
    {
      all.sd->ldict->~namedlabels();
      free(all.sd->ldict);
    }
    free(all.sd);
  }
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
    if (all.final_prediction_sink[i] != 1)
      io_buf::close_file_or_socket(all.final_prediction_sink[i]);
  all.final_prediction_sink.delete_v();
  for (size_t i = 0; i < all.loaded_dictionaries.size(); i++)
  {
    // Warning C6001 is triggered by the following:
    // (a) dictionary_info.name is allocated using 'calloc_or_throw<char>(strlen(s)+1)' and (b) freed using
    // 'free(all.loaded_dictionaries[i].name)'
    //
    // When the call to allocation is replaced by (a) 'new char[strlen(s)+1]' and deallocated using (b) 'delete []', the
    // warning goes away. Disable SDL warning.
    //    #pragma warning(disable:6001)
    free_it(all.loaded_dictionaries[i].name);
    //#pragma warning(default:6001)

    all.loaded_dictionaries[i].dict->iter(delete_dictionary_entry);
    all.loaded_dictionaries[i].dict->delete_v();
    free_it(all.loaded_dictionaries[i].dict);
  }
  delete all.loss;

  delete all.all_reduce;

  if (delete_all)
    delete &all;

  if (finalize_regressor_exception_thrown)
    throw finalize_regressor_exception;
}